

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingExtension
          (MergedDescriptorDatabase *this,StringViewArg containing_type,int field_number,
          FileDescriptorProto *output)

{
  DescriptorDatabase *pDVar1;
  int iVar2;
  pointer ppDVar3;
  byte bVar4;
  ulong uVar5;
  byte unaff_R13B;
  ulong uVar6;
  FileDescriptorProto temp;
  FileDescriptorProto FStack_128;
  
  ppDVar3 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->sources_).
      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppDVar3) {
    uVar5 = 0;
    do {
      iVar2 = (*ppDVar3[uVar5]->_vptr_DescriptorDatabase[4])
                        (ppDVar3[uVar5],containing_type,(ulong)(uint)field_number,output);
      if ((char)iVar2 != '\0') {
        FileDescriptorProto::FileDescriptorProto(&FStack_128,(Arena *)0x0);
        bVar4 = 1;
        unaff_R13B = true;
        if (uVar5 == 0) goto LAB_002659d1;
        unaff_R13B = false;
        uVar6 = 0;
        goto LAB_002659a5;
      }
      uVar5 = uVar5 + 1;
      ppDVar3 = (this->sources_).
                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->sources_).
                                   super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3))
    ;
  }
  bVar4 = 0;
  goto LAB_002659d9;
  while( true ) {
    uVar6 = uVar6 + 1;
    unaff_R13B = uVar5 <= uVar6;
    if (uVar6 == uVar5) break;
LAB_002659a5:
    pDVar1 = (this->sources_).
             super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6];
    iVar2 = (*pDVar1->_vptr_DescriptorDatabase[2])
                      (pDVar1,(ulong)(output->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc,&FStack_128);
    if ((char)iVar2 != '\0') break;
  }
LAB_002659d1:
  FileDescriptorProto::~FileDescriptorProto(&FStack_128);
LAB_002659d9:
  return (bool)(bVar4 & unaff_R13B);
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (void* p : files_to_delete_) {
    operator delete(p);
  }
}